

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayoutengine.cpp
# Opt level: O3

void __thiscall
QGridLayoutRowData::stealBox
          (QGridLayoutRowData *this,int start,int end,int which,qreal *positions,qreal *sizes)

{
  char *pcVar1;
  long lVar2;
  double dVar3;
  
  if (start < end) {
    pcVar1 = (this->ignore).d.d.ptr;
    lVar2 = 0;
    dVar3 = 0.0;
    do {
      if (((byte)pcVar1[(start + lVar2 >> 3) + 1] >> (start + (int)lVar2 & 7U) & 1) == 0) {
        (*(code *)(&DAT_006affe4 + *(int *)(&DAT_006affe4 + (ulong)(uint)which * 4)))(0);
        return;
      }
      positions[lVar2] = dVar3;
      sizes[lVar2] = 0.0;
      dVar3 = dVar3 + 0.0;
      lVar2 = lVar2 + 1;
    } while ((start - end) + (int)lVar2 != 0);
  }
  return;
}

Assistant:

void QGridLayoutRowData::stealBox(int start, int end, int which, qreal *positions, qreal *sizes)
{
    qreal offset = 0.0;
    qreal nextSpacing = 0.0;

    for (int i = start; i < end; ++i) {
        qreal avail = 0.0;

        if (!ignore.testBit(i)) {
            const QGridLayoutBox &box = boxes.at(i);
            avail = box.q_sizes(which);
            offset += nextSpacing;
            nextSpacing = spacings.at(i);
        }

        *positions++ = offset;
        *sizes++ = avail;
        offset += avail;
    }
}